

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

int Prs_ManReadName(Prs_Man_t *p)

{
  int iVar1;
  char *local_20;
  char *pStart;
  Prs_Man_t *p_local;
  
  local_20 = p->pCur;
  iVar1 = Prs_ManIsChar(p,'\\');
  if (iVar1 == 0) {
    iVar1 = Prs_CharIsSymb1(*p->pCur);
    if (iVar1 == 0) {
      return 0;
    }
    p->pCur = p->pCur + 1;
    while (iVar1 = Prs_CharIsSymb2(*p->pCur), iVar1 != 0) {
      p->pCur = p->pCur + 1;
    }
  }
  else {
    local_20 = p->pCur + 1;
    p->pCur = local_20;
    while (iVar1 = Prs_ManIsChar(p,' '), iVar1 == 0) {
      p->pCur = p->pCur + 1;
    }
  }
  iVar1 = Abc_NamStrFindOrAddLim(p->pStrs,local_20,p->pCur,(int *)0x0);
  return iVar1;
}

Assistant:

static inline int Prs_ManReadName( Prs_Man_t * p )
{
    char * pStart = p->pCur;
    if ( Prs_ManIsChar(p, '\\') ) // escaped name
    {
        pStart = ++p->pCur;
        while ( !Prs_ManIsChar(p, ' ') ) 
            p->pCur++;
    }    
    else if ( Prs_CharIsSymb1(*p->pCur) ) // simple name
    {
        p->pCur++;
        while ( Prs_CharIsSymb2(*p->pCur) ) 
            p->pCur++;
    }
    else 
        return 0;
    return Abc_NamStrFindOrAddLim( p->pStrs, pStart, p->pCur, NULL );
}